

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept_mdapi.cpp
# Opt level: O1

cl_command_queue __thiscall
CLIntercept::createMDAPICommandQueue
          (CLIntercept *this,cl_context context,cl_device_id device,
          cl_command_queue_properties properties,cl_int *errcode_ret)

{
  _Rb_tree_header *p_Var1;
  IMetricSetLatest *pIVar2;
  bool bVar3;
  int iVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  mapped_type *pmVar7;
  long lVar8;
  cl_command_queue p_Var9;
  undefined8 uVar10;
  _Rb_tree_header *p_Var11;
  cl_uint cVar12;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float __x;
  float __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  cl_int errorCode;
  cl_platform_id platform;
  cl_int local_74;
  undefined1 local_70 [32];
  pthread_mutex_t *local_50;
  cl_device_id local_48;
  cl_context local_40;
  cl_command_queue_properties local_38;
  
  local_50 = (pthread_mutex_t *)&this->m_Mutex;
  local_40 = context;
  local_38 = properties;
  iVar4 = pthread_mutex_lock(local_50);
  if (iVar4 != 0) {
    uVar10 = std::__throw_system_error(iVar4);
    if ((key_type)local_70._0_8_ != (key_type)(local_70 + 0x10)) {
      operator_delete((void *)local_70._0_8_);
    }
    pthread_mutex_unlock(local_50);
    _Unwind_Resume(uVar10);
  }
  local_70._0_8_ = (cl_platform_id)0x0;
  local_48 = device;
  (*(this->m_Dispatch).clGetDeviceInfo)(device,0x1031,8,local_70,(size_t *)0x0);
  uVar10 = local_70._0_8_;
  p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0;
      p_Var5 = (&p_Var5->_M_left)[*(cl_platform_id *)(p_Var5 + 1) < (ulong)local_70._0_8_]) {
    if (*(cl_platform_id *)(p_Var5 + 1) >= (ulong)local_70._0_8_) {
      p_Var6 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
     (p_Var5 = p_Var6, (ulong)local_70._0_8_ < *(cl_platform_id *)(p_Var6 + 1))) {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    local_70._0_8_ = (cl_platform_id)0x0;
    pmVar7 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)local_70);
  }
  else {
    pmVar7 = (mapped_type *)&p_Var5[1]._M_parent;
  }
  if (pmVar7->clCreatePerfCountersCommandQueueINTEL ==
      (_func_cl_command_queue_cl_context_cl_device_id_cl_command_queue_properties_cl_uint_cl_int_ptr
       *)0x0) {
    local_70._0_8_ = (cl_platform_id)(local_70 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"clCreatePerfCountersCommandQueueINTEL","");
    getExtensionFunctionAddress(this,(cl_platform_id)uVar10,(string *)local_70);
    if ((cl_platform_id)local_70._0_8_ != (cl_platform_id)(local_70 + 0x10)) {
      operator_delete((void *)local_70._0_8_);
    }
  }
  p_Var5 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
      p_Var5 = (&p_Var5->_M_left)[*(cl_platform_id *)(p_Var5 + 1) < (ulong)uVar10]) {
    if (*(cl_platform_id *)(p_Var5 + 1) >= (ulong)uVar10) {
      p_Var6 = p_Var5;
    }
  }
  p_Var11 = p_Var1;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
     (p_Var11 = (_Rb_tree_header *)p_Var6,
     (ulong)uVar10 < (cl_platform_id)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
    p_Var11 = p_Var1;
  }
  if (p_Var11 == p_Var1) {
    local_70._0_8_ = (cl_platform_id)0x0;
    pmVar7 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)local_70);
  }
  else {
    pmVar7 = (mapped_type *)(p_Var11 + 1);
  }
  if (pmVar7->clCreatePerfCountersCommandQueueINTEL ==
      (_func_cl_command_queue_cl_context_cl_device_id_cl_command_queue_properties_cl_uint_cl_int_ptr
       *)0x0) {
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,
               "Couldn\'t get pointer to clCreatePerfCountersCommandQueueINTEL!\n","");
    log(this,__x_01);
  }
  else if (this->m_pMDHelper == (MDHelper *)0x0) {
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Metrics discovery is not initialized!\n","");
    log(this,__x_02);
  }
  else {
    bVar3 = MetricsDiscovery::MDHelper::ActivateMetricSet(this->m_pMDHelper);
    if (bVar3) {
      local_74 = 0;
      pIVar2 = this->m_pMDHelper->m_MetricSet;
      if (pIVar2 == (IMetricSetLatest *)0x0) {
        cVar12 = 0;
        __x = extraout_XMM0_Da;
      }
      else {
        lVar8 = (**(code **)(*(long *)pIVar2 + 0x10))();
        cVar12 = *(cl_uint *)(lVar8 + 0x5c);
        __x = extraout_XMM0_Da_00;
      }
      logf(this,__x);
      p_Var9 = (*pmVar7->clCreatePerfCountersCommandQueueINTEL)
                         (local_40,local_48,local_38,cVar12,&local_74);
      if (p_Var9 == (cl_command_queue)0x0) {
        CEnumNameMap::name_abi_cxx11_((string *)local_70,&this->m_EnumNameMap,local_74);
        logf(this,__x_00);
        if ((cl_platform_id)local_70._0_8_ != (cl_platform_id)(local_70 + 0x10)) goto LAB_0019a806;
      }
      else {
        local_70._0_8_ = (cl_platform_id)(local_70 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_70,"clCreatePerfCountersCommandQueueINTEL succeeded.\n","");
        log(this,__x_04);
        if ((cl_platform_id)local_70._0_8_ != (cl_platform_id)(local_70 + 0x10)) {
LAB_0019a806:
          operator_delete((void *)local_70._0_8_);
        }
      }
      if (errcode_ret != (cl_int *)0x0) {
        *errcode_ret = local_74;
      }
      goto LAB_0019a77b;
    }
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Metric Discovery: Couldn\'t activate metric set!\n","");
    log(this,__x_03);
  }
  if ((cl_platform_id)local_70._0_8_ != (cl_platform_id)(local_70 + 0x10)) {
    operator_delete((void *)local_70._0_8_);
  }
  p_Var9 = (cl_command_queue)0x0;
LAB_0019a77b:
  pthread_mutex_unlock(local_50);
  return p_Var9;
}

Assistant:

cl_command_queue CLIntercept::createMDAPICommandQueue(
    cl_context context,
    cl_device_id device,
    cl_command_queue_properties properties,
    cl_int* errcode_ret )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_command_queue    retVal = NULL;

    cl_platform_id  platform = getPlatform(device);
    if( dispatchX(platform).clCreatePerfCountersCommandQueueINTEL == NULL )
    {
        getExtensionFunctionAddress(
            platform,
            "clCreatePerfCountersCommandQueueINTEL" );
    }

    const auto& dispatchX = this->dispatchX(platform);
    if( dispatchX.clCreatePerfCountersCommandQueueINTEL == NULL )
    {
        log( "Couldn't get pointer to clCreatePerfCountersCommandQueueINTEL!\n" );
    }
    else if( m_pMDHelper == NULL )
    {
        log( "Metrics discovery is not initialized!\n" );
    }
    else if( m_pMDHelper->ActivateMetricSet() )
    {
        cl_int  errorCode = CL_SUCCESS;
        cl_uint configuration = m_pMDHelper->GetMetricsConfiguration();
        logf( "Calling clCreatePerfCountersCommandQueueINTEL with configuration %u....\n",
            configuration);

        retVal = dispatchX.clCreatePerfCountersCommandQueueINTEL(
            context,
            device,
            properties,
            configuration,
            &errorCode );
        if( retVal == NULL )
        {
            logf( "clCreatePerfCountersCommandQueueINTEL returned %s (%d)!\n",
                enumName().name( errorCode ).c_str(),
                errorCode );
        }
        else
        {
            log( "clCreatePerfCountersCommandQueueINTEL succeeded.\n" );
        }
        if( errcode_ret )
        {
            errcode_ret[0] = errorCode;
        }
    }
    else
    {
        log( "Metric Discovery: Couldn't activate metric set!\n" );
    }

    return retVal;
}